

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  int iVar1;
  int ret;
  secp256k1_gej pj;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff74;
  secp256k1_scalar *in_stack_ffffffffffffff78;
  secp256k1_scalar *in_stack_ffffffffffffff80;
  secp256k1_gej *in_stack_ffffffffffffffa8;
  secp256k1_ge *in_stack_ffffffffffffffb0;
  
  iVar1 = secp256k1_scalar_set_b32_seckey
                    (in_stack_ffffffffffffff60,
                     (uchar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  secp256k1_scalar_cmov
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  secp256k1_ecmult_gen(ecmult_gen_ctx,(secp256k1_gej *)seckey_scalar,(secp256k1_scalar *)p);
  secp256k1_ge_set_gej(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  secp256k1_gej_clear((secp256k1_gej *)0x162fe89);
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    secp256k1_gej_clear(&pj);
    return ret;
}